

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangle.cpp
# Opt level: O1

bool __thiscall chrono::geometry::ChTriangle::Normal(ChTriangle *this,ChVector<double> *N)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 extraout_var [56];
  undefined1 auVar17 [16];
  
  dVar7 = (this->p1).m_data[0];
  dVar1 = (this->p1).m_data[1];
  dVar2 = (this->p2).m_data[0] - dVar7;
  dVar3 = (this->p2).m_data[1] - dVar1;
  dVar15 = (this->p1).m_data[2];
  dVar4 = (this->p2).m_data[2] - dVar15;
  dVar7 = (this->p3).m_data[0] - dVar7;
  dVar1 = (this->p3).m_data[1] - dVar1;
  dVar15 = (this->p3).m_data[2] - dVar15;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar3;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar15;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1 * dVar4;
  auVar12 = vfmsub231sd_fma(auVar18,auVar12,auVar16);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar7;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar4;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar15 * dVar2;
  auVar8 = vfmsub231sd_fma(auVar17,auVar10,auVar14);
  dVar15 = auVar8._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar7 * dVar3;
  auVar10 = vfmsub231sd_fma(auVar13,auVar8,auVar11);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar15 * dVar15;
  auVar8 = vfmadd231sd_fma(auVar6,auVar12,auVar12);
  auVar8 = vfmadd231sd_fma(auVar8,auVar10,auVar10);
  if (auVar8._0_8_ < 0.0) {
    auVar9._0_8_ = sqrt(auVar8._0_8_);
    auVar9._8_56_ = extraout_var;
    auVar8 = auVar9._0_16_;
  }
  else {
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
  }
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar6 = vandpd_avx512vl(auVar8,auVar5);
  if (1e-20 < auVar6._0_8_) {
    dVar7 = 1.0 / auVar8._0_8_;
    N->m_data[0] = auVar12._0_8_ * dVar7;
    N->m_data[1] = dVar7 * dVar15;
    N->m_data[2] = auVar10._0_8_ * dVar7;
  }
  return 1e-20 < auVar6._0_8_;
}

Assistant:

bool ChTriangle::Normal(ChVector<>& N) const {
    ChVector<> u;
    u = Vsub(p2, p1);
    ChVector<> v;
    v = Vsub(p3, p1);

    ChVector<> n;
    n = Vcross(u, v);

    double len = Vlength(n);

    if (fabs(len) > EPS_TRIDEGENERATE)
        N = Vmul(n, (1.0 / len));
    else
        return false;

    return true;
}